

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::
ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
::ArrayWithPreallocation
          (ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
           *this,ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *other)

{
  ulong uVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  this->numActive = 0;
  this->numAllocated = 8;
  uVar1 = other->numAllocated;
  if (uVar1 < 9) {
    this->items = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this->space;
    uVar1 = other->numActive;
    this->numActive = uVar1;
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
      std::__cxx11::string::string
                ((string *)((long)&(this->items->_M_dataplus)._M_p + lVar3),
                 (string *)((long)&(other->items->_M_dataplus)._M_p + lVar3));
      uVar1 = this->numActive;
      lVar3 = lVar3 + 0x20;
    }
  }
  else {
    this->items = other->items;
    this->numActive = other->numActive;
    this->numAllocated = uVar1;
    other->items = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)other->space
    ;
    other->numAllocated = 8;
    other->numActive = 0;
  }
  return;
}

Assistant:

ArrayWithPreallocation (ArrayWithPreallocation&& other) noexcept
    {
        if (other.isHeapAllocated())
        {
            items = other.items;
            numActive = other.numActive;
            numAllocated = other.numAllocated;
            other.resetToInternalStorage();
            other.numActive = 0;
        }
        else
        {
            items = getPreallocatedSpace();
            numActive = other.numActive;

            for (size_t i = 0; i < numActive; ++i)
                new (items + i) Item (std::move (other.items[i]));
        }
    }